

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

value_type * __thiscall
QList<QByteArray>::takeFirst(value_type *__return_storage_ptr__,QList<QByteArray> *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  iterator iVar4;
  
  iVar4 = begin(this);
  pDVar2 = ((iVar4.i)->d).d;
  pcVar3 = ((iVar4.i)->d).ptr;
  ((iVar4.i)->d).d = (Data *)0x0;
  ((iVar4.i)->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = pcVar3;
  qVar1 = ((iVar4.i)->d).size;
  ((iVar4.i)->d).size = 0;
  (__return_storage_ptr__->d).size = qVar1;
  QtPrivate::QGenericArrayOps<QByteArray>::eraseFirst((QGenericArrayOps<QByteArray> *)this);
  return __return_storage_ptr__;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }